

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O0

_Bool chck_utf8_validate(char *u8)

{
  uint32_t uVar1;
  byte local_25;
  uint32_t local_24;
  uint32_t uStack_20;
  uint8_t i;
  uint32_t cp;
  uint32_t state;
  uint8_t mb;
  char *u8_local;
  
  _state = u8;
  if (u8 == (char *)0x0) {
    __assert_fail("u8",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/unicode/unicode.c"
                  ,0x78,"_Bool chck_utf8_validate(const char *)");
  }
  cp._3_1_ = chck_utf8_mblen(u8);
  uStack_20 = 0;
  local_25 = 0;
  while( true ) {
    if (cp._3_1_ <= local_25) {
      return cp._3_1_ != 0;
    }
    uVar1 = chck_utf8_decode(&stack0xffffffffffffffe0,&local_24,_state[local_25]);
    if (uVar1 == 1) break;
    local_25 = local_25 + 1;
  }
  return false;
}

Assistant:

bool
chck_utf8_validate(const char u8[4])
{
   assert(u8);

   const uint8_t mb = chck_utf8_mblen(u8);
   uint32_t state = CHCK_UTF8_ACCEPT, cp;
   for (uint8_t i = 0; i < mb; ++i) {
      if (chck_utf8_decode(&state, &cp, u8[i]) == CHCK_UTF8_REJECT)
         return false;
   }

   return (mb > 0);
}